

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void fsync_cb(uv_fs_t *req)

{
  int iVar1;
  undefined8 extraout_RAX;
  uv_fs_t *puVar2;
  char *pcVar3;
  undefined8 in_R9;
  undefined8 uVar4;
  
  if (req == &fsync_req) {
    pcVar3 = (char *)req;
    if (fsync_req.fs_type != UV_FS_FSYNC) goto LAB_0015a13d;
    if (fsync_req.result != 0) goto LAB_0015a142;
    fsync_cb_count = fsync_cb_count + 1;
    uv_fs_req_cleanup(&fsync_req);
    pcVar3 = (char *)loop;
    iVar1 = uv_fs_close(loop,&close_req,(undefined4)open_req1.result,close_cb);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    fsync_cb_cold_1();
    pcVar3 = (char *)req;
LAB_0015a13d:
    fsync_cb_cold_2();
LAB_0015a142:
    fsync_cb_cold_3();
  }
  fsync_cb_cold_4();
  if ((uv_fs_t *)pcVar3 == &close_req) {
    if (close_req.fs_type != UV_FS_CLOSE) goto LAB_0015a1b3;
    if (close_req.result != 0) goto LAB_0015a1b8;
    close_cb_count = close_cb_count + 1;
    uv_fs_req_cleanup(&close_req);
    if (close_cb_count != 3) {
      return;
    }
    pcVar3 = (char *)loop;
    iVar1 = uv_fs_unlink(loop,&unlink_req,"test_file2",unlink_cb);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    close_cb_cold_1();
LAB_0015a1b3:
    close_cb_cold_2();
LAB_0015a1b8:
    close_cb_cold_3();
  }
  close_cb_cold_4();
  if ((uv_fs_t *)pcVar3 == &read_req) {
    if (read_req.fs_type != UV_FS_READ) goto LAB_0015a285;
    if (read_req.result < 0) goto LAB_0015a28a;
    read_cb_count = read_cb_count + 1;
    puVar2 = &read_req;
    uVar4 = extraout_RAX;
    uv_fs_req_cleanup();
    if (read_cb_count == 1) {
      pcVar3 = buf;
      iVar1 = strcmp(buf,test_buf);
      if (iVar1 == 0) {
        pcVar3 = (char *)loop;
        iVar1 = uv_fs_ftruncate(loop,&ftruncate_req,(undefined4)open_req1.result,7,ftruncate_cb,
                                in_R9,uVar4);
        goto LAB_0015a27a;
      }
      goto LAB_0015a294;
    }
    pcVar3 = (char *)puVar2;
    if (buf._0_8_ == 0x75622d74736574) {
      pcVar3 = (char *)loop;
      iVar1 = uv_fs_close(loop,&close_req,(undefined4)open_req1.result,close_cb);
LAB_0015a27a:
      if (iVar1 == 0) {
        return;
      }
      goto LAB_0015a28f;
    }
  }
  else {
    read_cb_cold_1();
LAB_0015a285:
    read_cb_cold_2();
LAB_0015a28a:
    read_cb_cold_3();
LAB_0015a28f:
    read_cb_cold_6();
LAB_0015a294:
    read_cb_cold_5();
  }
  read_cb_cold_4();
  if ((uv_fs_t *)pcVar3 == &ftruncate_req) {
    if (ftruncate_req.fs_type != UV_FS_FTRUNCATE) goto LAB_0015a2fb;
    if (ftruncate_req.result == 0) {
      ftruncate_cb_count = ftruncate_cb_count + 1;
      uv_fs_req_cleanup(&ftruncate_req);
      iVar1 = uv_fs_close(loop,&close_req,(undefined4)open_req1.result,close_cb);
      if (iVar1 == 0) {
        return;
      }
      goto <EXTERNAL>_uv_signal_stop;
    }
  }
  else {
    ftruncate_cb_cold_1();
LAB_0015a2fb:
    ftruncate_cb_cold_2();
  }
  ftruncate_cb_cold_3();
<EXTERNAL>_uv_signal_stop:
  ftruncate_cb_cold_4();
  uv_signal_stop();
  return;
}

Assistant:

static void fsync_cb(uv_fs_t* req) {
  int r;
  ASSERT(req == &fsync_req);
  ASSERT(req->fs_type == UV_FS_FSYNC);
  ASSERT(req->result == 0);
  fsync_cb_count++;
  uv_fs_req_cleanup(req);
  r = uv_fs_close(loop, &close_req, open_req1.result, close_cb);
  ASSERT(r == 0);
}